

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

char * __thiscall
duckdb::StrfTimeFormat::WriteDateSpecifier
          (StrfTimeFormat *this,StrTimeSpecifier specifier,date_t date,char *target)

{
  int32_t iVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  InternalException *this_00;
  undefined1 *puVar7;
  bool monday_first;
  undefined7 in_register_00000031;
  StrfTimeFormat *this_01;
  ulong __n;
  string local_40 [4];
  date_t date_00;
  char local_30 [16];
  
  this_01 = (StrfTimeFormat *)(ulong)(uint)date.days;
  iVar4 = (int)CONCAT71(in_register_00000031,specifier);
  if (iVar4 < 0x19) {
    if (iVar4 == 0) {
      iVar4 = Date::ExtractISODayOfTheWeek(date);
      puVar7 = Date::DAY_NAMES_ABBREVIATED;
    }
    else {
      if (iVar4 != 1) {
        if (iVar4 == 2) {
          iVar1 = Date::ExtractISODayOfTheWeek(date);
          *target = ((char)(uint)((ulong)((long)iVar1 * 0x92492493) >> 0x22) -
                    (char)((long)iVar1 * 0x92492493 >> 0x3f)) * -7 + (char)iVar1 + '0';
          goto LAB_00a1551f;
        }
        goto switchD_00a1541e_caseD_1d;
      }
      iVar4 = Date::ExtractISODayOfTheWeek(date);
      puVar7 = Date::DAY_NAMES;
    }
    lVar6 = (long)(iVar4 % 7) * 0x10;
    __n = (ulong)*(uint *)(puVar7 + lVar6);
    if (__n < 0xd) {
      puVar7 = puVar7 + lVar6 + 4;
    }
    else {
      puVar7 = *(undefined1 **)(puVar7 + lVar6 + 8);
    }
    switchD_00b03519::default(target,puVar7,__n);
    return target + __n;
  }
  date_00.days = (int32_t)((ulong)_local_40 >> 0x20);
  switch(iVar4) {
  case 0x19:
    uVar2 = Date::ExtractDayOfTheYear(date_00);
    pcVar5 = WritePadded3(this_01,target,uVar2);
    return pcVar5;
  case 0x1a:
    uVar2 = Date::ExtractDayOfTheYear(date_00);
    iVar4 = NumericHelper::UnsignedLength<unsigned_int>(uVar2);
    NumericHelper::FormatUnsigned<unsigned_int>(uVar2,target + iVar4);
    return target + iVar4;
  case 0x1b:
    monday_first = false;
    break;
  case 0x1c:
    monday_first = true;
    break;
  default:
switchD_00a1541e_caseD_1d:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    _local_40 = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>
              (local_40,"Unimplemented date specifier for strftime","");
    InternalException::InternalException(this_00,(string *)local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x21:
    uVar3 = Date::ExtractISOYearNumber(date);
    lVar6 = 2;
    do {
      *(undefined2 *)(target + lVar6 * 2 + -2) =
           *(undefined2 *)
            (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(uVar3 % 100) * 2);
      lVar6 = lVar6 + -1;
      uVar3 = uVar3 / 100;
    } while (lVar6 != 0);
    return target + 4;
  case 0x22:
    iVar1 = Date::ExtractISODayOfTheWeek(date);
    *target = (char)iVar1 + '0';
LAB_00a1551f:
    return target + 1;
  case 0x23:
    iVar4 = Date::ExtractISOWeekNumber(date);
    goto LAB_00a154bd;
  }
  iVar4 = Date::ExtractWeekNumberRegular(date,monday_first);
LAB_00a154bd:
  *(undefined2 *)target =
       *(undefined2 *)(duckdb_fmt::v6::internal::basic_data<void>::digits + (uint)(iVar4 * 2));
  return target + 2;
}

Assistant:

char *StrfTimeFormat::WriteDateSpecifier(StrTimeSpecifier specifier, date_t date, char *target) const {
	switch (specifier) {
	case StrTimeSpecifier::ABBREVIATED_WEEKDAY_NAME: {
		auto dow = Date::ExtractISODayOfTheWeek(date);
		target = WriteString(target, Date::DAY_NAMES_ABBREVIATED[dow % 7]);
		break;
	}
	case StrTimeSpecifier::FULL_WEEKDAY_NAME: {
		auto dow = Date::ExtractISODayOfTheWeek(date);
		target = WriteString(target, Date::DAY_NAMES[dow % 7]);
		break;
	}
	case StrTimeSpecifier::WEEKDAY_DECIMAL: {
		auto dow = Date::ExtractISODayOfTheWeek(date);
		*target = char('0' + uint8_t(dow % 7));
		target++;
		break;
	}
	case StrTimeSpecifier::DAY_OF_YEAR_PADDED: {
		int32_t doy = Date::ExtractDayOfTheYear(date);
		target = WritePadded3(target, UnsafeNumericCast<uint32_t>(doy));
		break;
	}
	case StrTimeSpecifier::WEEK_NUMBER_PADDED_MON_FIRST:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(Date::ExtractWeekNumberRegular(date, true)));
		break;
	case StrTimeSpecifier::WEEK_NUMBER_PADDED_SUN_FIRST:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(Date::ExtractWeekNumberRegular(date, false)));
		break;
	case StrTimeSpecifier::WEEK_NUMBER_ISO:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(Date::ExtractISOWeekNumber(date)));
		break;
	case StrTimeSpecifier::DAY_OF_YEAR_DECIMAL: {
		auto doy = UnsafeNumericCast<uint32_t>(Date::ExtractDayOfTheYear(date));
		target += NumericHelper::UnsignedLength<uint32_t>(doy);
		NumericHelper::FormatUnsigned(doy, target);
		break;
	}
	case StrTimeSpecifier::YEAR_ISO:
		target = WritePadded(target, UnsafeNumericCast<uint32_t>(Date::ExtractISOYearNumber(date)), 4);
		break;
	case StrTimeSpecifier::WEEKDAY_ISO:
		*target = char('0' + uint8_t(Date::ExtractISODayOfTheWeek(date)));
		target++;
		break;
	default:
		throw InternalException("Unimplemented date specifier for strftime");
	}
	return target;
}